

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void __thiscall DPSprite::Destroy(DPSprite *this)

{
  player_t *ppVar1;
  DPSprite *pDVar2;
  DObject *pointed;
  DPSprite *pointing;
  
  ppVar1 = this->Owner;
  if ((ppVar1 == (player_t *)0x0) ||
     (pDVar2 = (ppVar1->psprites).field_0.p, pDVar2 == (DPSprite *)0x0)) goto LAB_0055907a;
  if (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0) {
    (ppVar1->psprites).field_0.p = (DPSprite *)0x0;
    goto LAB_0055907a;
  }
  if (pDVar2 == this) {
    pointed = (this->Next).field_0.o;
    (ppVar1->psprites).field_0.o = pointed;
    if (pointed == (DObject *)0x0) goto LAB_0055907a;
    if ((pointed->ObjectFlags & 0x20) != 0) goto LAB_005590be;
    if ((GC::State != 1) || ((pointed->ObjectFlags & 3) == 0)) goto LAB_0055907a;
    pointing = (DPSprite *)0x0;
  }
  else {
    do {
      pointing = pDVar2;
      pDVar2 = (pointing->Next).field_0.p;
      if (pDVar2 == (DPSprite *)0x0) goto LAB_0055907a;
      if (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0) {
        (pointing->Next).field_0.p = (DPSprite *)0x0;
        goto LAB_0055907a;
      }
    } while (pDVar2 != this);
    pointed = (this->Next).field_0.o;
    (pointing->Next).field_0.o = pointed;
    if (pointed == (DObject *)0x0) goto LAB_0055907a;
    if ((pointed->ObjectFlags & 0x20) != 0) {
LAB_005590be:
      (this->Next).field_0.p = (DPSprite *)0x0;
      goto LAB_0055907a;
    }
    if (((pointed->ObjectFlags & 3) == 0) || (((pointing->super_DObject).ObjectFlags & 4) == 0))
    goto LAB_0055907a;
  }
  GC::Barrier(&pointing->super_DObject,pointed);
LAB_0055907a:
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DPSprite::Destroy()
{
	// Do not crash if this gets called on partially initialized objects.
	if (Owner != nullptr && Owner->psprites != nullptr)
	{
		if (Owner->psprites != this)
		{
			DPSprite *prev = Owner->psprites;
			while (prev != nullptr && prev->Next != this)
				prev = prev->Next;

			if (prev != nullptr && prev->Next == this)
			{
				prev->Next = Next;
				GC::WriteBarrier(prev, Next);
			}
		}
		else
		{
			Owner->psprites = Next;
			GC::WriteBarrier(Next);
		}
	}
	Super::Destroy();
}